

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

string * __thiscall
cmComputeLinkInformation::GetRPathLinkString_abi_cxx11_
          (string *__return_storage_ptr__,cmComputeLinkInformation *this)

{
  bool bVar1;
  pointer this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rng;
  string_view local_50;
  string_view local_40 [2];
  allocator<char> local_19;
  cmComputeLinkInformation *local_18;
  cmComputeLinkInformation *this_local;
  
  local_18 = this;
  this_local = (cmComputeLinkInformation *)__return_storage_ptr__;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->OrderDependentRPath);
  if (bVar1) {
    this_00 = std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::
              operator->(&this->OrderDependentRPath);
    rng = cmOrderDirectories::GetOrderedDirectories_abi_cxx11_(this_00);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_40,":");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50);
    cmJoin(__return_storage_ptr__,rng,local_40[0],local_50);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmComputeLinkInformation::GetRPathLinkString() const
{
  // If there is no separate linker runtime search flag (-rpath-link)
  // there is no reason to compute a string.
  if (!this->OrderDependentRPath) {
    return "";
  }

  // Construct the linker runtime search path. These MUST NOT contain tokens
  // such as $ORIGIN, see https://sourceware.org/bugzilla/show_bug.cgi?id=16936
  return cmJoin(this->OrderDependentRPath->GetOrderedDirectories(), ":");
}